

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_create_module_function(JSContext *ctx,JSModuleDef *m)

{
  int *piVar1;
  byte bVar2;
  JSExportEntry *pJVar3;
  int64_t iVar4;
  JSValue v;
  int iVar5;
  JSVarRef *pJVar6;
  JSValueUnion JVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  JSValue v_00;
  
  if (m->field_0x81 != '\0') {
    return 0;
  }
  if (m->init_func == (JSModuleInitFunc *)0x0) {
    piVar1 = (int *)(m->func_obj).u.ptr;
    iVar4 = (m->func_obj).tag;
    v = m->func_obj;
    v_00 = JS_NewObjectProtoClass(ctx,ctx->function_proto,0xd);
    JVar7 = v_00.u;
    if ((uint)v_00.tag == 6) {
      return -1;
    }
    *(int **)((long)JVar7.ptr + 0x30) = piVar1;
    *piVar1 = *piVar1 + 1;
    ((int *)((long)JVar7.ptr + 0x38))[0] = 0;
    ((int *)((long)JVar7.ptr + 0x38))[1] = 0;
    ((int *)((long)JVar7.ptr + 0x40))[0] = 0;
    ((int *)((long)JVar7.ptr + 0x40))[1] = 0;
    if ((long)piVar1[0x17] != 0) {
      pvVar8 = js_mallocz(ctx,(long)piVar1[0x17] << 3);
      if (pvVar8 == (void *)0x0) {
LAB_0013d718:
        if ((uint)v_00.tag < 0xfffffff5) {
          return -1;
        }
        iVar5 = *JVar7.ptr;
        *(int *)JVar7.ptr = iVar5 + -1;
        if (1 < iVar5) {
          return -1;
        }
        __JS_FreeValueRT(ctx->rt,v_00);
        return -1;
      }
      *(void **)((long)JVar7.ptr + 0x38) = pvVar8;
      if (0 < piVar1[0x17]) {
        lVar9 = 0;
        do {
          bVar2 = *(byte *)(*(long *)(piVar1 + 0xe) + lVar9 * 8);
          if ((bVar2 & 1) != 0) {
            pJVar6 = js_create_module_var(ctx,bVar2 >> 3 & 1);
            if (pJVar6 == (JSVarRef *)0x0) goto LAB_0013d718;
            *(JSVarRef **)((long)pvVar8 + lVar9 * 8) = pJVar6;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < piVar1[0x17]);
      }
    }
    m->func_obj = v_00;
    if ((0xfffffff4 < (uint)iVar4) && (iVar5 = *piVar1, *piVar1 = iVar5 + -1, iVar5 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  else if (0 < m->export_entries_count) {
    lVar10 = 0x10;
    lVar9 = 0;
    do {
      pJVar3 = m->export_entries;
      if (*(int *)((long)&pJVar3->u + lVar10) == 0) {
        pJVar6 = js_create_module_var(ctx,0);
        if (pJVar6 == (JSVarRef *)0x0) {
          return -1;
        }
        *(JSVarRef **)((long)pJVar3 + lVar10 + -8) = pJVar6;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (lVar9 < m->export_entries_count);
  }
  m->field_0x81 = 1;
  if (0 < m->req_module_entries_count) {
    lVar10 = 8;
    lVar9 = 0;
    do {
      iVar5 = js_create_module_function
                        (ctx,*(JSModuleDef **)((long)&m->req_module_entries->module_name + lVar10));
      if (iVar5 < 0) {
        return -1;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar9 < m->req_module_entries_count);
  }
  return 0;
}

Assistant:

static int js_create_module_function(JSContext *ctx, JSModuleDef *m)
{
    BOOL is_c_module;
    int i;
    JSVarRef *var_ref;
    
    if (m->func_created)
        return 0;

    is_c_module = (m->init_func != NULL);

    if (is_c_module) {
        /* initialize the exported variables */
        for(i = 0; i < m->export_entries_count; i++) {
            JSExportEntry *me = &m->export_entries[i];
            if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
                var_ref = js_create_module_var(ctx, FALSE);
                if (!var_ref)
                    return -1;
                me->u.local.var_ref = var_ref;
            }
        }
    } else {
        if (js_create_module_bytecode_function(ctx, m))
            return -1;
    }
    m->func_created = TRUE;

    /* do it on the dependencies */
    
    for(i = 0; i < m->req_module_entries_count; i++) {
        JSReqModuleEntry *rme = &m->req_module_entries[i];
        if (js_create_module_function(ctx, rme->module) < 0)
            return -1;
    }

    return 0;
}